

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int dupedExprNodeSize(Expr *p,int flags)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *z2;
  char *pcVar4;
  
  iVar2 = 0x48;
  if (((((flags & 1U) != 0) && (iVar2 = 0x2c, p->pLeft == (Expr *)0x0)) &&
      (p->pRight == (Expr *)0x0)) && (iVar2 = 0x2c, (p->x).pList == (ExprList *)0x0)) {
    iVar2 = 0x10;
  }
  if (((p->flags & 0x400) == 0) && (pcVar4 = (p->u).zToken, pcVar4 != (char *)0x0)) {
    uVar3 = 0xffffffff;
    do {
      uVar3 = uVar3 + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    iVar2 = iVar2 + (uVar3 & 0x3fffffff) + 1;
  }
  return iVar2 + 7U & 0xfffffff8;
}

Assistant:

static int dupedExprNodeSize(Expr *p, int flags){
  int nByte = dupedExprStructSize(p, flags) & 0xfff;
  if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
    nByte += sqlite3Strlen30(p->u.zToken)+1;
  }
  return ROUND8(nByte);
}